

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

bool Limonp::Logger::LoggingF(uint level,char *fileName,int lineNo,string *fmt,...)

{
  char in_AL;
  bool bVar1;
  char *__s;
  size_t __maxlen;
  char *__format;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int n;
  va_list ap;
  string msg;
  int size;
  int in_stack_0000031c;
  char *in_stack_00000320;
  string *in_stack_00000328;
  uint in_stack_00000330;
  undefined1 local_128 [32];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  int local_78;
  undefined4 local_68;
  undefined4 local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  string local_48 [36];
  int local_24;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  undefined4 local_4;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_24 = 0x100;
  local_108 = in_R8;
  local_100 = in_R9;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::__cxx11::string::string(local_48);
  while( true ) {
    std::__cxx11::string::resize((ulong)local_48);
    local_58 = local_128;
    local_60 = &stack0x00000008;
    local_64 = 0x30;
    local_68 = 0x20;
    __s = (char *)std::__cxx11::string::c_str();
    __maxlen = (size_t)local_24;
    __format = (char *)std::__cxx11::string::c_str();
    local_78 = vsnprintf(__s,__maxlen,__format,&local_68);
    if ((-1 < local_78) && (local_78 < local_24)) break;
    if (local_78 < 0) {
      local_24 = local_24 << 1;
    }
    else {
      local_24 = local_78 + 1;
    }
  }
  std::__cxx11::string::resize((ulong)local_48);
  bVar1 = Logging(in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_0000031c);
  std::__cxx11::string::~string(local_48);
  return bVar1;
}

Assistant:

static bool LoggingF(uint level, const char* fileName, int lineNo, const string& fmt, ...)
            {
                int size = 256;
                string msg;
                va_list ap;
                while (1) {
                    msg.resize(size);
                    va_start(ap, fmt);
                    int n = vsnprintf((char *)msg.c_str(), size, fmt.c_str(), ap);
                    va_end(ap);
                    if (n > -1 && n < size) {
                        msg.resize(n);
                        break;
                    }
                    if (n > -1)
                      size = n + 1;
                    else
                      size *= 2;
                }
                return Logging(level, msg, fileName, lineNo);
            }